

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O2

int If_CutDelaySop(If_Man_t *p,If_Cut_t *pCut)

{
  long lVar1;
  float fVar2;
  uint uVar3;
  Vec_Wec_t *p_00;
  int iVar4;
  If_Obj_t *pIVar5;
  Vec_Int_t *p_01;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  char cVar13;
  
  uVar12 = *(uint *)&pCut->field_0x1c;
  *(uint *)&pCut->field_0x1c = uVar12 | 0x2000;
  iVar9 = 0;
  if (0xffffff < uVar12) {
    uVar12 = uVar12 >> 0x18;
    if (uVar12 == 1) {
      pIVar5 = If_CutLeaf(p,pCut,0);
      iVar9 = (int)(pIVar5->CutBest).Delay;
    }
    else {
      p_00 = p->vTtIsops[uVar12];
      iVar9 = If_CutTruthLit(pCut);
      iVar9 = Abc_Lit2Var(iVar9);
      p_01 = Vec_WecEntry(p_00,iVar9);
      uVar7 = p_01->nSize;
      iVar9 = -1;
      if ((uVar7 != 0) && ((int)uVar7 <= p->pPars->nGateSize)) {
        uVar3 = *(uint *)&pCut->field_0x1c;
        if (0x10ffffff < uVar3) {
          __assert_fail("If_CutLeaveNum(pCut) >= 0 && If_CutLeaveNum(pCut) <= 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0x56,"int If_CutDelaySop(If_Man_t *, If_Cut_t *)");
        }
        lVar1 = (ulong)uVar12 * 4;
        iVar9 = 0;
        for (iVar10 = 0; iVar10 < (int)uVar7; iVar10 = iVar10 + 1) {
          iVar4 = Vec_IntEntry(p_01,iVar10);
          iVar8 = 0;
          for (iVar6 = 0; (uVar3 >> 0x18) * 2 != iVar6; iVar6 = iVar6 + 2) {
            iVar8 = iVar8 + (uint)((iVar4 >> ((byte)iVar6 & 0x1f) & 3U) - 1 < 2);
          }
          if (iVar9 <= iVar8) {
            iVar9 = iVar8;
          }
          uVar7 = p_01->nSize;
        }
        if ((int)uVar7 < 2) {
          uVar12 = *(uint *)&pCut->field_0x1c;
          uVar7 = uVar12 & 0xfffff000 | uVar7 & 0xfff;
          *(uint *)&pCut->field_0x1c = uVar7;
          cVar13 = (char)(int)(If_CutDelaySop::GateDelays[uVar12 >> 0x18] + 0.5);
          iVar9 = 0;
          for (uVar11 = 0; uVar11 < uVar7 >> 0x18; uVar11 = uVar11 + 1) {
            pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar11]);
            if (pIVar5 == (If_Obj_t *)0x0) {
              return iVar9;
            }
            fVar2 = (pIVar5->CutBest).Delay;
            *(char *)((long)&pCut[1].Area + uVar11 + lVar1) = cVar13;
            iVar10 = (int)(fVar2 + (float)(int)cVar13);
            if (iVar9 <= iVar10) {
              iVar9 = iVar10;
            }
            uVar7 = *(uint *)&pCut->field_0x1c;
          }
        }
        else {
          uVar12 = *(uint *)&pCut->field_0x1c;
          uVar7 = uVar12 & 0xfffff000 | uVar7 + 1 & 0xfff;
          *(uint *)&pCut->field_0x1c = uVar7;
          cVar13 = (char)(int)(If_CutDelaySop::GateDelays[uVar12 >> 0x18] +
                               If_CutDelaySop::GateDelays[iVar9] + 0.5);
          iVar9 = 0;
          for (uVar11 = 0; uVar11 < uVar7 >> 0x18; uVar11 = uVar11 + 1) {
            pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar11]);
            if (pIVar5 == (If_Obj_t *)0x0) {
              return iVar9;
            }
            fVar2 = (pIVar5->CutBest).Delay;
            *(char *)((long)&pCut[1].Area + uVar11 + lVar1) = cVar13;
            iVar10 = (int)(fVar2 + (float)(int)cVar13);
            if (iVar9 <= iVar10) {
              iVar9 = iVar10;
            }
            uVar7 = *(uint *)&pCut->field_0x1c;
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int If_CutDelaySop( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    // delay is calculated using 1+log2(NumFanins)
    static double GateDelays[20] = { 1.00, 1.00, 2.00, 2.58, 3.00, 3.32, 3.58, 3.81, 4.00, 4.17, 4.32, 4.46, 4.58, 4.70, 4.81, 4.91, 5.00, 5.09, 5.17, 5.25 };
    Vec_Int_t * vCover;
    If_Obj_t * pLeaf;
    int i, nLitMax, Delay, DelayMax;
    // mark cut as a user cut
    pCut->fUser = 1;
    if ( pCut->nLeaves == 0 )
        return 0;
    if ( pCut->nLeaves == 1 )
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
    if ( Vec_IntSize(vCover) == 0 )
        return -1;
    // mark the output as complemented
//    vAnds = If_CutDelaySopAnds( p, pCut, vCover, RetValue ^ pCut->fCompl );
    if ( Vec_IntSize(vCover) > p->pPars->nGateSize )
        return -1;
    // set the area cost
    assert( If_CutLeaveNum(pCut) >= 0 && If_CutLeaveNum(pCut) <= 16 );
    // compute the gate delay
    nLitMax = If_CutMaxCubeSize( vCover, If_CutLeaveNum(pCut) );
    if ( Vec_IntSize(vCover) < 2 )
    {
        pCut->Cost = Vec_IntSize(vCover);
        Delay = (int)(GateDelays[If_CutLeaveNum(pCut)] + 0.5);
        DelayMax = 0;
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            DelayMax = Abc_MaxInt( DelayMax, If_ObjCutBest(pLeaf)->Delay + (pPerm[i] = (char)Delay) );
    }
    else
    {
        pCut->Cost = Vec_IntSize(vCover) + 1;
        Delay = (int)(GateDelays[If_CutLeaveNum(pCut)] + GateDelays[nLitMax] + 0.5);
        DelayMax = 0;
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            DelayMax = Abc_MaxInt( DelayMax, If_ObjCutBest(pLeaf)->Delay + (pPerm[i] = (char)Delay) );
    }
    return DelayMax;
}